

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler_unittest.cc
# Opt level: O2

int main(int argc,char **argv)

{
  FILE *__stream;
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  pthread_t thread;
  char **argv_local;
  int argc_local;
  string command;
  
  argv_local = argv;
  argc_local = argc;
  google::InitGoogleLogging(*argv);
  google::ParseCommandLineFlags(&argc_local,&argv_local,true);
  google::InstallFailureSignalHandler();
  if (argc_local < 2) {
    pcVar3 = "none";
  }
  else {
    pcVar3 = argv_local[1];
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&command,pcVar3,(allocator<char> *)&thread);
  bVar1 = std::operator==(&command,"segv");
  if (bVar1) {
    google::LogMessage::LogMessage
              ((LogMessage *)&thread,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/signalhandler_unittest.cc"
               ,0x53);
    poVar2 = google::LogMessage::stream((LogMessage *)&thread);
    std::operator<<(poVar2,"create the log file");
    google::LogMessage::~LogMessage((LogMessage *)&thread);
    google::LogMessage::LogMessage
              ((LogMessage *)&thread,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/signalhandler_unittest.cc"
               ,0x54);
    poVar2 = google::LogMessage::stream((LogMessage *)&thread);
    std::operator<<(poVar2,"a message before segv");
    google::LogMessage::~LogMessage((LogMessage *)&thread);
    _DAT_0000dead = 0;
  }
  else {
    bVar1 = std::operator==(&command,"loop");
    if (bVar1) {
      fwrite("looping\n",8,1,_stderr);
      do {
      } while( true );
    }
    bVar1 = std::operator==(&command,"die_in_thread");
    if (bVar1) {
      pthread_create(&thread,(pthread_attr_t *)0x0,DieInThread,(void *)0x0);
      pthread_join(thread,(void **)0x0);
    }
    else {
      bVar1 = std::operator==(&command,"dump_to_stdout");
      if (bVar1) {
        google::InstallFailureWriter(WriteToStdout);
        abort();
      }
      bVar1 = std::operator==(&command,"installed");
      __stream = _stderr;
      if (bVar1) {
        bVar1 = google::glog_internal_namespace_::IsFailureSignalHandlerInstalled();
        pcVar3 = "false";
        if (bVar1) {
          pcVar3 = "true";
        }
        fprintf(__stream,"signal handler installed: %s\n",pcVar3);
      }
      else {
        puts("OK");
      }
    }
  }
  std::__cxx11::string::~string((string *)&command);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
#if defined(HAVE_STACKTRACE) && defined(HAVE_SYMBOLIZE)
  InitGoogleLogging(argv[0]);
#ifdef HAVE_LIB_GFLAGS
  ParseCommandLineFlags(&argc, &argv, true);
#endif
  InstallFailureSignalHandler();
  const std::string command = argc > 1 ? argv[1] : "none";
  if (command == "segv") {
    // We'll check if this is outputted.
    LOG(INFO) << "create the log file";
    LOG(INFO) << "a message before segv";
    // We assume 0xDEAD is not writable.
    int *a = (int*)0xDEAD;
    *a = 0;
  } else if (command == "loop") {
    fprintf(stderr, "looping\n");
    while (true);
  } else if (command == "die_in_thread") {
#if defined(HAVE_PTHREAD)
    pthread_t thread;
    pthread_create(&thread, NULL, &DieInThread, NULL);
    pthread_join(thread, NULL);
#else
    fprintf(stderr, "no pthread\n");
    return 1;
#endif
  } else if (command == "dump_to_stdout") {
    InstallFailureWriter(WriteToStdout);
    abort();
  } else if (command == "installed") {
    fprintf(stderr, "signal handler installed: %s\n",
        IsFailureSignalHandlerInstalled() ? "true" : "false");
  } else {
    // Tell the shell script
    puts("OK");
  }
#endif
  return 0;
}